

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlChar * xmlEscapeText(xmlChar *text,int flags)

{
  ulong uVar1;
  byte bVar2;
  uint val;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  byte *str;
  int iVar10;
  size_t __n;
  int chunkSize;
  char buf [12];
  byte *local_68;
  int local_5c;
  xmlChar *local_58;
  uint local_4c;
  size_t local_48;
  byte local_3c [12];
  
  local_58 = (xmlChar *)(*xmlMalloc)(0x33);
  if (local_58 == (xmlChar *)0x0) {
LAB_0012ed90:
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    pxVar4 = local_58;
    if (*text != '\0') {
      local_4c = flags & 5;
      uVar6 = 0x32;
      pbVar9 = text;
LAB_0012e9aa:
      local_5c = 1;
      iVar10 = (int)pbVar9 + -1;
      iVar8 = (int)pbVar9 + -3;
      str = pbVar9;
      do {
        pbVar9 = str + 1;
        bVar2 = *str;
        if ((long)(char)bVar2 < 0) {
          if ((flags & 2U) != 0) goto LAB_0012e9e6;
        }
        else if (""[(char)bVar2] == '\0') goto LAB_0012e9e6;
        iVar10 = iVar10 + 1;
        iVar8 = iVar8 + 1;
        str = pbVar9;
      } while( true );
    }
LAB_0012ed7c:
    *local_58 = '\0';
  }
  return pxVar4;
LAB_0012e9e6:
  local_68 = str;
  if (bVar2 < 0x3c) {
    if (bVar2 == 0) {
      local_5c = 0;
LAB_0012ea97:
      local_68 = (byte *)0x1e160f;
      sVar5 = 0;
      pbVar9 = str;
    }
    else if (bVar2 == 0x26) {
      sVar5 = 5;
      if ((local_4c == 5) && (*pbVar9 == 0x7b)) {
        pxVar3 = xmlStrchr(str,'}');
        if (pxVar3 != (xmlChar *)0x0) {
          iVar10 = (int)pxVar3 - iVar10;
          local_5c = iVar10;
          goto LAB_0012ecf5;
        }
        local_68 = (byte *)0x1cb7e5;
        sVar5 = 5;
        pbVar9 = str;
      }
      else {
        local_68 = (byte *)0x1cb7e5;
        pbVar9 = str;
      }
    }
    else {
LAB_0012ea6c:
      if (((flags & 8U) == 0) || (sVar5 = 6, bVar2 != 0x22)) {
        if (((flags & 4U) == 0) && (sVar5 = 5, bVar2 == 0xd)) {
          local_68 = (byte *)0x1cb7eb;
          pbVar9 = str;
        }
        else {
          if (((flags & 2U) != 0) && ((char)bVar2 < '\0')) {
            local_5c = 4;
            val = xmlGetUTF8Char(str,&local_5c);
            if ((int)val < 0) {
              local_5c = 1;
LAB_0012ecd4:
              val = 0xfffd;
            }
            else if ((flags & 0x10U) == 0) {
              if (val < 0x100) {
                if (val < 0x20) {
                  if (4 < val - 9) goto LAB_0012ecd4;
                  val = *(uint *)(&DAT_001cb880 + (ulong)(val - 9) * 4);
                }
              }
              else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val))
              goto LAB_0012ecd4;
            }
            iVar10 = xmlSerializeHexCharRef((char *)local_3c,val);
            local_68 = local_3c;
            goto LAB_0012ecf5;
          }
          if ((((bVar2 != 0xd) && ((flags & 0x14U) == 0)) && (bVar2 < 0x20)) &&
             (1 < (byte)(bVar2 - 9))) goto LAB_0012ea97;
          if (*pbVar9 != 0) goto LAB_0012ec0c;
          local_5c = 0;
          local_68 = (byte *)0x1e160f;
          sVar5 = 0;
        }
      }
      else {
        local_68 = (byte *)0x1cb000;
        pbVar9 = str;
      }
    }
  }
  else if (bVar2 == 0x3c) {
    sVar5 = 4;
    if ((((local_4c == 5) && (*pbVar9 == 0x21)) && (str[2] == 0x2d)) && (str[3] == 0x2d)) {
      pxVar3 = xmlStrstr(str,"-->");
      if (pxVar3 == (xmlChar *)0x0) {
        local_68 = (byte *)0x1cb7db;
        sVar5 = 4;
        pbVar9 = str;
      }
      else {
        iVar10 = (int)pxVar3 - iVar8;
        local_5c = iVar10;
LAB_0012ecf5:
        sVar5 = (size_t)iVar10;
        pbVar9 = str;
      }
    }
    else {
      local_68 = (byte *)0x1cb7db;
      pbVar9 = str;
    }
  }
  else {
    if (bVar2 != 0x3e) goto LAB_0012ea6c;
    sVar5 = 4;
    local_68 = (byte *)0x1cb7e0;
    pbVar9 = str;
  }
  lVar7 = (long)local_58 - (long)pxVar4;
  __n = (long)pbVar9 - (long)text;
  uVar1 = __n + sVar5;
  pbVar9 = pbVar9 + local_5c;
  pxVar3 = local_58;
  local_58 = pxVar4;
  local_48 = sVar5;
  if (uVar6 - lVar7 < uVar1) {
    if (((long)uVar6 < 0) || ((uVar6 ^ 0x7fffffffffffffff) < uVar1)) {
LAB_0012ed82:
      (*xmlFree)(local_58);
      goto LAB_0012ed90;
    }
    iVar10 = (int)uVar1 + (int)uVar6 << (*pbVar9 != 0);
    pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)(iVar10 + 1));
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0012ed82;
    uVar6 = (ulong)iVar10;
    pxVar3 = pxVar4 + lVar7;
  }
  memcpy(pxVar3,text,__n);
  sVar5 = local_48;
  memcpy(pxVar3 + __n,local_68,local_48);
  local_58 = pxVar3 + __n + sVar5;
  text = pbVar9;
LAB_0012ec0c:
  if (*pbVar9 == 0) goto LAB_0012ed7c;
  goto LAB_0012e9aa;
}

Assistant:

xmlChar *
xmlEscapeText(const xmlChar *text, int flags) {
    const xmlChar *cur;
    xmlChar *buffer;
    xmlChar *out;
    const xmlChar *unescaped;
    size_t size = 50;

    buffer = xmlMalloc(size + 1);
    if (buffer == NULL)
        return(NULL);
    out = buffer;

    cur = text;
    unescaped = cur;

    while (*cur != '\0') {
        char buf[12];
	const xmlChar *end;
        const xmlChar *repl;
        size_t used;
        size_t replSize;
        size_t unescapedSize;
        size_t totalSize;
        int chunkSize = 1;
        int c;

        /* accelerator */
	while (1) {
            c = *cur;

            if (c < 0x80) {
                if (!xmlEscapeSafe[*cur])
                    break;
            } else {
               if (flags & XML_ESCAPE_NON_ASCII)
                   break;
            }
            cur += 1;
        }

        if (c == 0) {
            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
        } else if (c == '<') {
	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
                chunkSize = (end - cur) + 3;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&lt;";
                replSize = 4;
            }
	} else if (c == '>') {
            repl = BAD_CAST "&gt;";
            replSize = 4;
	} else if (c == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
                (cur[1] == '{') && (end = xmlStrchr(cur, '}'))) {
                chunkSize = (end - cur) + 1;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&amp;";
                replSize = 5;
            }
	} else if ((flags & XML_ESCAPE_QUOT) && (c == '"')) {
            repl = BAD_CAST "&quot;";
            replSize = 6;
	} else if (((flags & XML_ESCAPE_HTML) == 0) && (c == '\r')) {
	    repl = BAD_CAST "&#13;";
            replSize = 5;
	} else if ((flags & XML_ESCAPE_NON_ASCII) && (c >= 0x80)) {
            int val;

            chunkSize = 4;
            val = xmlGetUTF8Char(cur, &chunkSize);
            if (val < 0) {
                val = 0xFFFD;
                chunkSize = 1;
            } else if (((flags & XML_ESCAPE_ALLOW_INVALID) == 0) &&
                       (!IS_CHAR(val))) {
                val = 0xFFFD;
            }

            replSize = xmlSerializeHexCharRef(buf, val);
            repl = BAD_CAST buf;
	} else if ((flags & (XML_ESCAPE_ALLOW_INVALID | XML_ESCAPE_HTML)) ||
                   (c >= 0x20) ||
	           (c == '\n') || (c == '\t') || (c == '\r')) {
	    /* default case, just copy */
            cur += 1;
            if (*cur != 0)
                continue;

            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
	} else {
            /* ignore */
            repl = BAD_CAST "";
            replSize = 0;
        }

        used = out - buffer;
        unescapedSize = cur - unescaped;
        totalSize = unescapedSize + replSize;

	cur += chunkSize;

        if (totalSize > size - used) {
            xmlChar *tmp;
            int newSize;

            if ((size > (SIZE_MAX - 1) / 2) ||
                (totalSize > (SIZE_MAX - 1) / 2 - size)) {
                xmlFree(buffer);
                return(NULL);
            }
            newSize = size + totalSize;
            if (*cur != 0)
                newSize *= 2;
            tmp = xmlRealloc(buffer, newSize + 1);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            size = newSize;
            out = buffer + used;
        }

        memcpy(out, unescaped, unescapedSize);
        out += unescapedSize;
        memcpy(out, repl, replSize);
        out += replSize;

        unescaped = cur;
    }

    *out = 0;
    return(buffer);
}